

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O2

void __thiscall WorkQueue<CGL::WorkItem>::put_work(WorkQueue<CGL::WorkItem> *this,WorkItem *item)

{
  std::mutex::lock(&this->lock);
  std::vector<CGL::WorkItem,_std::allocator<CGL::WorkItem>_>::push_back(&this->storage,item);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void put_work(const T& item) {
    lock.lock();
    storage.push_back(item);
    lock.unlock();
  }